

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Client::process_request
          (Client *this,Stream *strm,Request *req,Response *res,bool *connection_close)

{
  bool *x;
  Request *strm_00;
  bool bVar1;
  bool local_c1;
  string local_a8;
  function<bool_(unsigned_long,_unsigned_long)> local_88;
  string local_58;
  bool *local_38;
  bool *connection_close_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Client *this_local;
  
  local_38 = connection_close;
  connection_close_local = (bool *)res;
  res_local = (Response *)req;
  req_local = (Request *)strm;
  strm_local = (Stream *)this;
  write_request(this,strm,req);
  bVar1 = read_response_line(this,(Stream *)req_local,(Response *)connection_close_local);
  if ((!bVar1) ||
     (bVar1 = detail::read_headers((Stream *)req_local,(Headers *)(connection_close_local + 0x28)),
     !bVar1)) {
    return false;
  }
  Response::get_header_value_abi_cxx11_(&local_58,(Response *)connection_close_local,"Connection",0)
  ;
  bVar1 = std::operator==(&local_58,"close");
  local_c1 = true;
  if (!bVar1) {
    local_c1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               connection_close_local,"HTTP/1.0");
  }
  std::__cxx11::string::~string((string *)&local_58);
  if (local_c1 != false) {
    *local_38 = true;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &res_local->status,"HEAD");
  strm_00 = req_local;
  x = connection_close_local;
  if (bVar1) {
    std::function<bool_(unsigned_long,_unsigned_long)>::function
              (&local_88,(function<bool_(unsigned_long,_unsigned_long)> *)&res_local[2].status);
    bVar1 = detail::read_content<httplib::Response>((Stream *)strm_00,(Response *)x,&local_88);
    std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_88);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    Response::get_header_value_abi_cxx11_
              (&local_a8,(Response *)connection_close_local,"Content-Encoding",0);
    bVar1 = std::operator==(&local_a8,"gzip");
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

inline bool Client::process_request(Stream& strm, Request& req, Response& res, bool& connection_close)
{
    // Send request
    write_request(strm, req);

    // Receive response and headers
    if (!read_response_line(strm, res) || !detail::read_headers(strm, res.headers)) {
        return false;
    }

    if (res.get_header_value("Connection") == "close" || res.version == "HTTP/1.0") {
        connection_close = true;
    }

    // Body
    if (req.method != "HEAD") {
        if (!detail::read_content(strm, res, req.progress)) {
            return false;
        }

        if (res.get_header_value("Content-Encoding") == "gzip") {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
            detail::decompress(res.body);
#else
            return false;
#endif
        }
    }

    return true;
}